

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O3

void __thiscall QUrlQueryPrivate::addQueryItem(QUrlQueryPrivate *this,QString *key,QString *value)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Data *pDVar7;
  qsizetype qVar8;
  qsizetype qVar9;
  char16_t *pcVar10;
  QArrayData *pQVar11;
  long in_FS_OFFSET;
  QArrayData *pQVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char16_t *pcVar15;
  QStringView in;
  QStringView in_00;
  pair<QString,_QString> local_88;
  undefined1 local_58 [16];
  qsizetype local_48;
  undefined4 local_40;
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = ZEXT816(0);
  local_48 = 0;
  uVar1 = this->valueDelimiter;
  uVar3 = this->pairDelimiter;
  uVar5 = *(undefined4 *)&this->field_0x24;
  auVar13._4_4_ = uVar5;
  auVar13._2_2_ = uVar3;
  auVar13._0_2_ = uVar1;
  auVar13._8_8_ = 0;
  auVar13 = pshuflw(auVar13,auVar13,0xe1);
  local_40 = auVar13._0_4_;
  local_3c = 0x23;
  in.m_data = (key->d).ptr;
  in.m_size = (key->d).size;
  qVar8 = qt_urlRecode((QString *)local_58,in,(ComponentFormattingOptions)0x2000000,
                       (ushort *)&local_40);
  if (qVar8 == 0) {
    pQVar11 = &((key->d).d)->super_QArrayData;
    pcVar10 = (key->d).ptr;
    qVar8 = (key->d).size;
    if (pQVar11 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&pQVar11->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&pQVar11->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
  }
  else {
    qVar8 = local_48;
    pcVar10 = (char16_t *)local_58._8_8_;
    pQVar11 = (QArrayData *)local_58._0_8_;
  }
  local_58 = (undefined1  [16])0x0;
  local_48 = 0;
  uVar2 = this->valueDelimiter;
  uVar4 = this->pairDelimiter;
  uVar6 = *(undefined4 *)&this->field_0x24;
  auVar14._4_4_ = uVar6;
  auVar14._2_2_ = uVar4;
  auVar14._0_2_ = uVar2;
  auVar14._8_8_ = 0;
  auVar13 = pshuflw(auVar14,auVar14,0xe1);
  local_40 = auVar13._0_4_;
  local_3c = 0x23;
  in_00.m_data = (value->d).ptr;
  in_00.m_size = (value->d).size;
  qVar9 = qt_urlRecode((QString *)local_58,in_00,(ComponentFormattingOptions)0x2000000,
                       (ushort *)&local_40);
  if (qVar9 == 0) {
    pQVar12 = &((value->d).d)->super_QArrayData;
    pcVar15 = (value->d).ptr;
    pDVar7 = (value->d).d;
    qVar9 = (value->d).size;
    if (pDVar7 != (Data *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
  }
  else {
    qVar9 = local_48;
    pQVar12 = (QArrayData *)local_58._0_8_;
    pcVar15 = (char16_t *)local_58._8_8_;
  }
  local_88.first.d.d = (Data *)pQVar11;
  local_88.first.d.ptr = pcVar10;
  local_88.first.d.size = qVar8;
  local_88.second.d.d = (Data *)pQVar12;
  local_88.second.d.ptr = pcVar15;
  local_88.second.d.size = qVar9;
  QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::emplace<std::pair<QString,QString>>
            ((QMovableArrayOps<std::pair<QString,QString>> *)&this->itemList,(this->itemList).d.size
             ,&local_88);
  QList<std::pair<QString,_QString>_>::end(&this->itemList);
  if (&(local_88.second.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_88.second.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.first.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.first.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.first.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addQueryItem(const QString &key, const QString &value)
    { itemList.append(std::make_pair(recodeFromUser(key), recodeFromUser(value))); }